

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O3

uint8_t bcm2835_i2c_write(char *buf,uint32_t len)

{
  uint *puVar1;
  uint32_t *puVar2;
  uint32_t *paddr;
  uint8_t uVar3;
  int iVar4;
  uint8_t uVar5;
  uint uVar6;
  int iVar8;
  ulong uVar9;
  ulong uVar7;
  
  paddr = bcm2835_bsc1;
  puVar1 = bcm2835_bsc1 + 1;
  bcm2835_peri_set_bits(bcm2835_bsc1,0x20,0x20);
  if (debug == '\0') {
    *puVar1 = 0x302;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",puVar1,0x302);
  }
  if (debug == '\0') {
    paddr[2] = len;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",paddr + 2,len);
  }
  puVar2 = paddr + 4;
  uVar5 = debug;
  if (len == 0) {
    iVar4 = 0;
    uVar7 = 0;
  }
  else {
    uVar6 = 0xf;
    if (len - 1 < 0xf) {
      uVar6 = len - 1;
    }
    uVar7 = (ulong)(uVar6 + 1);
    uVar9 = 0;
    uVar3 = debug;
    do {
      if (uVar3 == '\0') {
        *puVar2 = (int)buf[uVar9];
        uVar3 = '\0';
      }
      else {
        printf("bcm2835_peri_write_nb paddr %p, value %08X\n",puVar2);
        uVar3 = debug;
        uVar5 = debug;
      }
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
    iVar4 = len - (int)uVar9;
  }
  if (uVar5 == '\0') {
    *paddr = 0x8080;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",paddr,0x8080);
  }
LAB_001030b4:
  do {
    do {
      iVar8 = iVar4;
      if (debug == '\0') {
        if ((*puVar1 & 2) != 0) {
          uVar5 = '\x01';
          if (((*puVar1 >> 8 & 1) == 0) && (uVar5 = '\x02', (*puVar1 >> 9 & 1) == 0)) {
            uVar5 = (iVar8 != 0) << 2;
          }
          bcm2835_peri_set_bits(paddr,2,2);
          return uVar5;
        }
      }
      else {
        printf("bcm2835_peri_read  paddr %p\n",puVar1);
      }
      iVar4 = 0;
    } while (iVar8 == 0);
    do {
      iVar4 = iVar8;
      if (debug != '\0') {
        printf("bcm2835_peri_read  paddr %p\n",puVar1);
        goto LAB_001030b4;
      }
      if ((*puVar1 & 0x10) == 0) goto LAB_001030b4;
      *puVar2 = (int)buf[uVar7];
      uVar7 = (ulong)((int)uVar7 + 1);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    iVar4 = 0;
  } while( true );
}

Assistant:

uint8_t bcm2835_i2c_write(const char * buf, uint32_t len)
{
#ifdef I2C_V1
    volatile uint32_t* dlen    = bcm2835_bsc0 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc0 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc0 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc0 + BCM2835_BSC_C/4;
#else
    volatile uint32_t* dlen    = bcm2835_bsc1 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc1 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc1 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc1 + BCM2835_BSC_C/4;
#endif    

    uint32_t remaining = len;
    uint32_t i = 0;
    uint8_t reason = BCM2835_I2C_REASON_OK;

    /* Clear FIFO */
    bcm2835_peri_set_bits(control, BCM2835_BSC_C_CLEAR_1 , BCM2835_BSC_C_CLEAR_1 );
    /* Clear Status */
    bcm2835_peri_write(status, BCM2835_BSC_S_CLKT | BCM2835_BSC_S_ERR | BCM2835_BSC_S_DONE);
    /* Set Data Length */
    bcm2835_peri_write(dlen, len);
    /* pre populate FIFO with max buffer */
    while( remaining && ( i < BCM2835_BSC_FIFO_SIZE ) )
    {
        bcm2835_peri_write_nb(fifo, buf[i]);
        i++;
        remaining--;
    }
    
    /* Enable device and start transfer */
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN | BCM2835_BSC_C_ST);
    
    /* Transfer is over when BCM2835_BSC_S_DONE */
    while(!(bcm2835_peri_read(status) & BCM2835_BSC_S_DONE ))
    {
        while ( remaining && (bcm2835_peri_read(status) & BCM2835_BSC_S_TXD ))
    	{
	    /* Write to FIFO */
	    bcm2835_peri_write(fifo, buf[i]);
	    i++;
	    remaining--;
    	}
    }

    /* Received a NACK */
    if (bcm2835_peri_read(status) & BCM2835_BSC_S_ERR)
    {
	reason = BCM2835_I2C_REASON_ERROR_NACK;
    }

    /* Received Clock Stretch Timeout */
    else if (bcm2835_peri_read(status) & BCM2835_BSC_S_CLKT)
    {
	reason = BCM2835_I2C_REASON_ERROR_CLKT;
    }

    /* Not all data is sent */
    else if (remaining)
    {
	reason = BCM2835_I2C_REASON_ERROR_DATA;
    }

    bcm2835_peri_set_bits(control, BCM2835_BSC_S_DONE , BCM2835_BSC_S_DONE);

    return reason;
}